

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  Input *this_00;
  byte *pbVar1;
  Input *pIVar2;
  char *__src;
  undefined2 *puVar3;
  double dVar4;
  StructBuilder other;
  StructBuilder other_00;
  undefined8 uVar5;
  undefined8 uVar6;
  Orphan<capnp::json::Value> *pOVar7;
  RemoveConst<capnp::Orphan<capnp::json::Value>_> *pRVar8;
  Orphan<capnp::json::Value> *pOVar9;
  Builder *pBVar10;
  byte bVar11;
  bool bVar12;
  char cVar13;
  BuilderArena *arena;
  CapTableBuilder *pCVar14;
  unsigned_long i;
  long lVar15;
  Exception *pEVar16;
  size_t sVar17;
  long lVar18;
  size_t needed;
  ulong uVar19;
  SegmentBuilder *pSVar20;
  char *ptrCopy;
  long lVar21;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  Reader value;
  ArrayPtr<const_char> expected_01;
  Reader value_00;
  Fault f;
  Vector<capnp::Orphan<capnp::json::Value>_> values;
  Orphan<capnp::json::Value> orphan;
  Builder array;
  undefined1 local_118 [48];
  Vector<capnp::Orphan<capnp::json::Value>_> local_e8;
  Builder *local_c0;
  StructBuilder local_b8;
  PointerBuilder local_88;
  undefined1 local_68 [40];
  CapTableBuilder *local_40;
  BuilderArena *local_38;
  
  this_00 = &this->input;
  local_c0 = output;
  Input::consumeWhitespace(this_00);
  if (((this->input).wrapped.size_ == 0) ||
     (pIVar2 = (Input *)(this->input).wrapped.ptr, *(char *)&(pIVar2->wrapped).ptr == '\0')) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x27a,FAILED,"!input.exhausted()","\"JSON message ends prematurely.\"",
               (char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
  bVar11 = Input::nextChar(pIVar2);
  if (bVar11 < 0x5b) {
    if (9 < bVar11 - 0x30) {
      if (bVar11 == 0x22) {
        consumeQuotedString((String *)&local_b8,this);
        pCVar14 = local_b8.capTable;
        pSVar20 = local_b8.segment;
        pEVar16 = (Exception *)0x4f5114;
        if ((SegmentBuilder *)local_b8.capTable != (SegmentBuilder *)0x0) {
          pEVar16 = (Exception *)local_b8.segment;
        }
        value.super_StringPtr.content.size_ =
             (long)&((SegmentReader *)&(local_b8.capTable)->super_CapTableReader)->arena +
             (ulong)((SegmentBuilder *)local_b8.capTable == (SegmentBuilder *)0x0);
        *(undefined2 *)(local_c0->_builder).data = 3;
        local_118._16_8_ = (local_c0->_builder).pointers;
        local_118._0_8_ = (local_c0->_builder).segment;
        local_118._8_8_ = (local_c0->_builder).capTable;
        value.super_StringPtr.content.ptr = (char *)pEVar16;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_118,value);
        if ((Exception *)pSVar20 != (Exception *)0x0) {
          local_b8.segment = (SegmentBuilder *)0x0;
          local_b8.capTable = (CapTableBuilder *)0x0;
          (**(code **)*local_b8.data)(local_b8.data,pSVar20,1,pCVar14,pCVar14,0);
        }
        goto LAB_00389907;
      }
      if (bVar11 != 0x2d) goto LAB_0038a28a;
    }
    __src = (this_00->wrapped).ptr;
    Input::tryConsume(this_00,'-');
    bVar12 = Input::tryConsume(this_00,'0');
    if (!bVar12) {
      cVar13 = Input::nextChar((Input *)(this->input).wrapped.ptr);
      if (8 < (byte)(cVar13 - 0x31U)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x24a,FAILED,"predicate(current)","\"Unexpected input in JSON message.\"",
                   (char (*) [34])"Unexpected input in JSON message.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      Input::advance(this_00,1);
      while ((((this->input).wrapped.size_ != 0 &&
              (pIVar2 = (Input *)(this_00->wrapped).ptr, *(char *)&(pIVar2->wrapped).ptr != '\0'))
             && (cVar13 = Input::nextChar(pIVar2), (byte)(cVar13 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    bVar12 = Input::tryConsume(this_00,'.');
    if (bVar12 && (this->input).wrapped.size_ != 0) {
      do {
        pIVar2 = (Input *)(this_00->wrapped).ptr;
        if ((*(char *)&(pIVar2->wrapped).ptr == '\0') ||
           (cVar13 = Input::nextChar(pIVar2), 9 < (byte)(cVar13 - 0x30U))) break;
        Input::advance(this_00,1);
      } while ((this->input).wrapped.size_ != 0);
    }
    bVar12 = Input::tryConsume(this_00,'e');
    if ((bVar12) || (bVar12 = Input::tryConsume(this_00,'E'), bVar12)) {
      bVar12 = Input::tryConsume(this_00,'+');
      if (!bVar12) {
        Input::tryConsume(this_00,'-');
      }
      while ((((this->input).wrapped.size_ != 0 &&
              (pIVar2 = (Input *)(this_00->wrapped).ptr, *(char *)&(pIVar2->wrapped).ptr != '\0'))
             && (cVar13 = Input::nextChar(pIVar2), (byte)(cVar13 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    uVar19 = (long)(this_00->wrapped).ptr - (long)__src;
    if (uVar19 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                ((Fault *)local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x321,FAILED,"numArrayPtr.size() > 0","\"Expected number in JSON input.\"",
                 (char (*) [31])"Expected number in JSON input.");
      kj::_::Debug::Fault::fatal((Fault *)local_118);
    }
    local_118._0_8_ = (Exception *)0x0;
    local_118._8_8_ = (CapTableBuilder *)0x0;
    local_118._16_8_ = (Exception *)0x0;
    sVar17 = 4;
    if (4 < uVar19) {
      sVar17 = uVar19;
    }
    kj::Vector<char>::setCapacity((Vector<char> *)local_118,sVar17);
    uVar5 = local_118._8_8_;
    memcpy((void *)local_118._8_8_,__src,uVar19);
    local_118._8_8_ = uVar5 + uVar19;
    if (local_118._8_8_ == local_118._16_8_) {
      sVar17 = 4;
      if (local_118._8_8_ != local_118._0_8_) {
        sVar17 = (local_118._8_8_ - local_118._0_8_) * 2;
      }
      kj::Vector<char>::setCapacity((Vector<char> *)local_118,sVar17);
    }
    *(char *)&((SegmentReader *)local_118._8_8_)->arena = '\0';
    local_118._8_8_ = (long)&((SegmentReader *)local_118._8_8_)->arena + 1;
    if (local_118._8_8_ != local_118._16_8_) {
      kj::Vector<char>::setCapacity((Vector<char> *)local_118,local_118._8_8_ - local_118._0_8_);
    }
    uVar6 = local_118._24_8_;
    uVar5 = local_118._0_8_;
    pSVar20 = (SegmentBuilder *)(local_118._8_8_ - local_118._0_8_);
    local_b8.segment = (SegmentBuilder *)local_118._0_8_;
    local_b8.data = (void *)local_118._24_8_;
    pEVar16 = (Exception *)0x4f5114;
    if (pSVar20 != (SegmentBuilder *)0x0) {
      pEVar16 = (Exception *)local_118._0_8_;
    }
    local_118._8_8_ =
         (long)&(pSVar20->super_SegmentReader).arena + (ulong)(pSVar20 == (SegmentBuilder *)0x0);
    local_118._0_8_ = pEVar16;
    local_b8.capTable = (CapTableBuilder *)pSVar20;
    dVar4 = kj::StringPtr::parseAs<double>((StringPtr *)local_118);
    puVar3 = (undefined2 *)(local_c0->_builder).data;
    *puVar3 = 2;
    *(double *)(puVar3 + 4) = dVar4;
    if ((Exception *)uVar5 != (Exception *)0x0) {
      local_b8.segment = (SegmentBuilder *)0x0;
      local_b8.capTable = (CapTableBuilder *)0x0;
      (**(code **)*(WirePointer *)uVar6)(uVar6,uVar5,1,pSVar20,pSVar20,0);
    }
  }
  else if (bVar11 < 0x6e) {
    if (bVar11 == 0x5b) {
      local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
      local_118._32_4_ = (local_c0->_builder).dataSize;
      local_118._36_2_ = (local_c0->_builder).pointerCount;
      local_118[0x26] = (local_c0->_builder).field_0x26;
      local_118[0x27] = (local_c0->_builder).field_0x27;
      local_118._0_8_ = (local_c0->_builder).segment;
      local_118._8_8_ = (local_c0->_builder).capTable;
      local_118._16_8_ = (local_c0->_builder).data;
      local_118._24_8_ = (local_c0->_builder).pointers;
      arena = capnp::_::StructBuilder::getArena((StructBuilder *)local_118);
      pCVar14 = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_118);
      Input::consume(this_00,'[');
      uVar19 = this->nestingDepth + 1;
      this->nestingDepth = uVar19;
      if (this->maxNestingDepth < uVar19) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x29b,FAILED,"++nestingDepth <= maxNestingDepth",
                   "\"JSON message nested too deeply.\"",
                   (char (*) [32])"JSON message nested too deeply.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      bVar12 = false;
      while( true ) {
        Input::consumeWhitespace(this_00);
        cVar13 = Input::nextChar((Input *)(this->input).wrapped.ptr);
        pBVar10 = local_c0;
        if (cVar13 == ']') break;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_118,arena,pCVar14,(StructSize)0x10002);
        local_b8.capTable = (CapTableBuilder *)local_118._8_8_;
        local_b8.data = (void *)local_118._16_8_;
        local_b8.pointers = (WirePointer *)local_118._24_8_;
        local_b8.segment = (SegmentBuilder *)local_118._0_8_;
        capnp::_::OrphanBuilder::asStruct
                  ((StructBuilder *)local_118,(OrphanBuilder *)&local_b8,(StructSize)0x10002);
        if (bVar12) {
          Input::consumeWhitespace(this_00);
          Input::consume(this_00,',');
          Input::consumeWhitespace(this_00);
        }
        parseValue(this,(Builder *)local_118);
        if (local_e8.builder.pos == local_e8.builder.endPtr) {
          sVar17 = (long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4;
          if (local_e8.builder.pos == local_e8.builder.ptr) {
            sVar17 = 4;
          }
          kj::Vector<capnp::Orphan<capnp::json::Value>_>::setCapacity(&local_e8,sVar17);
        }
        ((local_e8.builder.pos)->builder).segment = (SegmentBuilder *)local_b8.capTable;
        ((local_e8.builder.pos)->builder).capTable = (CapTableBuilder *)local_b8.data;
        ((local_e8.builder.pos)->builder).location = (word *)local_b8.pointers;
        ((local_e8.builder.pos)->builder).tag.content = (uint64_t)local_b8.segment;
        local_e8.builder.pos = local_e8.builder.pos + 1;
        bVar12 = true;
      }
      *(undefined2 *)(local_c0->_builder).data = 4;
      local_b8.data = (local_c0->_builder).pointers;
      local_b8.segment = (local_c0->_builder).segment;
      local_b8.capTable = (local_c0->_builder).capTable;
      capnp::_::PointerBuilder::initStructList
                ((ListBuilder *)local_118,(PointerBuilder *)&local_b8,
                 (ElementCount)
                 ((ulong)((long)local_e8.builder.pos - (long)local_e8.builder.ptr) >> 5),
                 (StructSize)0x10002);
      local_118._16_8_ = (pBVar10->_builder).pointers;
      local_118._0_8_ = (pBVar10->_builder).segment;
      local_118._8_8_ = (pBVar10->_builder).capTable;
      capnp::_::PointerBuilder::getStructList
                ((ListBuilder *)local_68,(PointerBuilder *)local_118,(StructSize)0x10002,(word *)0x0
                );
      lVar18 = (long)local_e8.builder.pos - (long)local_e8.builder.ptr;
      if (lVar18 != 0) {
        lVar21 = 0;
        lVar15 = 0;
        do {
          pOVar7 = local_e8.builder.ptr;
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)local_118,(ListBuilder *)local_68,(ElementCount)lVar15);
          capnp::_::OrphanBuilder::asStruct
                    (&local_b8,(OrphanBuilder *)((long)&(pOVar7->builder).tag.content + lVar21),
                     (StructSize)0x0);
          other.capTable = local_b8.capTable;
          other.segment = local_b8.segment;
          other.data = local_b8.data;
          other.pointers = local_b8.pointers;
          other.dataSize = local_b8.dataSize;
          other.pointerCount = local_b8.pointerCount;
          other._38_2_ = local_b8._38_2_;
          capnp::_::StructBuilder::transferContentFrom((StructBuilder *)local_118,other);
          lVar15 = lVar15 + 1;
          lVar21 = lVar21 + 0x20;
        } while (lVar18 >> 5 != lVar15);
      }
      Input::consume(this_00,']');
      pOVar9 = local_e8.builder.endPtr;
      pRVar8 = local_e8.builder.pos;
      pOVar7 = local_e8.builder.ptr;
      this->nestingDepth = this->nestingDepth - 1;
      if (local_e8.builder.ptr != (Orphan<capnp::json::Value> *)0x0) {
        local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
        local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
        local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
        (**(local_e8.builder.disposer)->_vptr_ArrayDisposer)
                  (local_e8.builder.disposer,pOVar7,0x20,(long)pRVar8 - (long)pOVar7 >> 5,
                   (long)pOVar9 - (long)pOVar7 >> 5,
                   kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value>,_false>::destruct);
      }
    }
    else {
      if (bVar11 != 0x66) {
LAB_0038a28a:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x286,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                   (char (*) [34])"Unexpected input in JSON message.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      expected_00.size_ = 5;
      expected_00.ptr = "false";
      Input::consume(this_00,expected_00);
      puVar3 = (undefined2 *)(local_c0->_builder).data;
      *puVar3 = 1;
      pbVar1 = (byte *)(puVar3 + 1);
      *pbVar1 = *pbVar1 & 0xfe;
    }
  }
  else if (bVar11 == 0x7b) {
    local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
    local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
    local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
    local_118._32_4_ = (local_c0->_builder).dataSize;
    local_118._36_2_ = (local_c0->_builder).pointerCount;
    local_118[0x26] = (local_c0->_builder).field_0x26;
    local_118[0x27] = (local_c0->_builder).field_0x27;
    local_118._0_8_ = (local_c0->_builder).segment;
    local_118._8_8_ = (local_c0->_builder).capTable;
    local_118._16_8_ = (local_c0->_builder).data;
    local_118._24_8_ = (local_c0->_builder).pointers;
    local_38 = capnp::_::StructBuilder::getArena((StructBuilder *)local_118);
    local_40 = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_118);
    Input::consume(this_00,'{');
    uVar19 = this->nestingDepth + 1;
    this->nestingDepth = uVar19;
    if (this->maxNestingDepth < uVar19) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x2be,FAILED,"++nestingDepth <= maxNestingDepth",
                 "\"JSON message nested too deeply.\"",
                 (char (*) [32])"JSON message nested too deeply.");
      kj::_::Debug::Fault::fatal((Fault *)local_118);
    }
    bVar12 = false;
    while( true ) {
      Input::consumeWhitespace(this_00);
      cVar13 = Input::nextChar((Input *)(this->input).wrapped.ptr);
      pBVar10 = local_c0;
      if (cVar13 == '}') break;
      capnp::_::OrphanBuilder::initStruct
                ((OrphanBuilder *)local_118,local_38,local_40,(StructSize)0x20000);
      local_68._8_8_ = local_118._8_8_;
      local_68._16_8_ = local_118._16_8_;
      local_68._24_8_ = local_118._24_8_;
      local_68._0_8_ = local_118._0_8_;
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_118,(OrphanBuilder *)local_68,(StructSize)0x20000);
      if (bVar12) {
        Input::consumeWhitespace(this_00);
        Input::consume(this_00,',');
        Input::consumeWhitespace(this_00);
      }
      consumeQuotedString((String *)&local_88,this);
      pCVar14 = local_88.capTable;
      pSVar20 = local_88.segment;
      pEVar16 = (Exception *)local_88.segment;
      if ((SegmentBuilder *)local_88.capTable == (SegmentBuilder *)0x0) {
        pEVar16 = (Exception *)0x4f5114;
      }
      value_00.super_StringPtr.content.size_ =
           (long)&((SegmentReader *)&(local_88.capTable)->super_CapTableReader)->arena +
           (ulong)((SegmentBuilder *)local_88.capTable == (SegmentBuilder *)0x0);
      local_b8.segment = (SegmentBuilder *)local_118._0_8_;
      local_b8.capTable = (CapTableBuilder *)local_118._8_8_;
      local_b8.data = (void *)local_118._24_8_;
      value_00.super_StringPtr.content.ptr = (char *)pEVar16;
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_b8,value_00);
      if ((Exception *)pSVar20 != (Exception *)0x0) {
        local_88.segment = (SegmentBuilder *)0x0;
        local_88.capTable = (CapTableBuilder *)0x0;
        (**(code **)*local_88.pointer)(local_88.pointer,pSVar20,1,pCVar14,pCVar14,0);
      }
      Input::consumeWhitespace(this_00);
      Input::consume(this_00,':');
      Input::consumeWhitespace(this_00);
      local_88.pointer = (WirePointer *)(local_118._24_8_ + 8);
      local_88.segment = (SegmentBuilder *)local_118._0_8_;
      local_88.capTable = (CapTableBuilder *)local_118._8_8_;
      capnp::_::PointerBuilder::getStruct(&local_b8,&local_88,(StructSize)0x10002,(word *)0x0);
      parseValue(this,(Builder *)&local_b8);
      if (local_e8.builder.pos == local_e8.builder.endPtr) {
        sVar17 = (long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4;
        if (local_e8.builder.pos == local_e8.builder.ptr) {
          sVar17 = 4;
        }
        kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::setCapacity
                  ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&local_e8,sVar17);
      }
      ((local_e8.builder.pos)->builder).segment = (SegmentBuilder *)local_68._8_8_;
      ((local_e8.builder.pos)->builder).capTable = (CapTableBuilder *)local_68._16_8_;
      ((local_e8.builder.pos)->builder).location = (word *)local_68._24_8_;
      ((local_e8.builder.pos)->builder).tag.content = local_68._0_8_;
      local_e8.builder.pos = local_e8.builder.pos + 1;
      bVar12 = true;
    }
    *(undefined2 *)(local_c0->_builder).data = 5;
    local_b8.data = (local_c0->_builder).pointers;
    local_b8.segment = (local_c0->_builder).segment;
    local_b8.capTable = (local_c0->_builder).capTable;
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)local_118,(PointerBuilder *)&local_b8,
               (ElementCount)((ulong)((long)local_e8.builder.pos - (long)local_e8.builder.ptr) >> 5)
               ,(StructSize)0x20000);
    local_118._16_8_ = (pBVar10->_builder).pointers;
    local_118._0_8_ = (pBVar10->_builder).segment;
    local_118._8_8_ = (pBVar10->_builder).capTable;
    capnp::_::PointerBuilder::getStructList
              ((ListBuilder *)local_68,(PointerBuilder *)local_118,(StructSize)0x20000,(word *)0x0);
    lVar18 = (long)local_e8.builder.pos - (long)local_e8.builder.ptr;
    if (lVar18 != 0) {
      lVar21 = 0;
      lVar15 = 0;
      do {
        pOVar7 = local_e8.builder.ptr;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)local_118,(ListBuilder *)local_68,(ElementCount)lVar15);
        capnp::_::OrphanBuilder::asStruct
                  (&local_b8,(OrphanBuilder *)((long)&(pOVar7->builder).tag.content + lVar21),
                   (StructSize)0x0);
        other_00.capTable = local_b8.capTable;
        other_00.segment = local_b8.segment;
        other_00.data = local_b8.data;
        other_00.pointers = local_b8.pointers;
        other_00.dataSize = local_b8.dataSize;
        other_00.pointerCount = local_b8.pointerCount;
        other_00._38_2_ = local_b8._38_2_;
        capnp::_::StructBuilder::transferContentFrom((StructBuilder *)local_118,other_00);
        lVar15 = lVar15 + 1;
        lVar21 = lVar21 + 0x20;
      } while (lVar18 >> 5 != lVar15);
    }
    Input::consume(this_00,'}');
    pOVar9 = local_e8.builder.endPtr;
    pRVar8 = local_e8.builder.pos;
    pOVar7 = local_e8.builder.ptr;
    this->nestingDepth = this->nestingDepth - 1;
    if (local_e8.builder.ptr != (Orphan<capnp::json::Value> *)0x0) {
      local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
      (**(local_e8.builder.disposer)->_vptr_ArrayDisposer)
                (local_e8.builder.disposer,pOVar7,0x20,(long)pRVar8 - (long)pOVar7 >> 5,
                 (long)pOVar9 - (long)pOVar7 >> 5,
                 kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value::Field>,_false>::
                 destruct);
    }
  }
  else if (bVar11 == 0x74) {
    expected_01.size_ = 4;
    expected_01.ptr = "true";
    Input::consume(this_00,expected_01);
    puVar3 = (undefined2 *)(local_c0->_builder).data;
    *puVar3 = 1;
    pbVar1 = (byte *)(puVar3 + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  else {
    if (bVar11 != 0x6e) goto LAB_0038a28a;
    expected.size_ = 4;
    expected.ptr = "null";
    Input::consume(this_00,expected);
    *(undefined2 *)(local_c0->_builder).data = 0;
  }
LAB_00389907:
  Input::consumeWhitespace(this_00);
  return;
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume(kj::StringPtr("null"));  output.setNull();         break;
      case 'f': input.consume(kj::StringPtr("false")); output.setBoolean(false); break;
      case 't': input.consume(kj::StringPtr("true"));  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }